

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::_q_updateButtonStates(QWizardPrivate *this)

{
  QAbstractButton *pQVar1;
  bool bVar2;
  Int IVar3;
  QWizardPage *pQVar4;
  qsizetype qVar5;
  QPushButton *pQVar6;
  QWizardPrivate *pQVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar8;
  undefined8 extraout_RDX_03;
  QWizardPrivate *in_RDI;
  long in_FS_OFFSET;
  QPushButton *finishPush;
  QPushButton *commitPush;
  QPushButton *nextPush;
  bool useDefault;
  bool commitPage;
  bool backButtonVisible;
  bool complete;
  QWizardPage *page;
  QWizard *q;
  undefined4 in_stack_fffffffffffffec8;
  WizardOption in_stack_fffffffffffffecc;
  QWizardPrivate *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  bool enable;
  QWizardPrivate *in_stack_fffffffffffffee0;
  WizardButton in_stack_fffffffffffffeec;
  bool local_101;
  bool local_f2;
  bool local_f1;
  bool local_e1;
  byte local_d2;
  bool local_d1;
  bool local_c4;
  bool local_c3;
  bool local_c2;
  bool local_c1;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_28;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_24;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_20;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_1c;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_18;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_14;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_10;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  disableUpdates(in_stack_fffffffffffffed0);
  pQVar4 = QWizard::currentPage((QWizard *)in_stack_fffffffffffffed0);
  if (pQVar4 != (QWizardPage *)0x0) {
    (**(code **)(*(long *)&pQVar4->super_QWidget + 0x1b8))();
  }
  qVar5 = QList<int>::size(&in_RDI->history);
  if (1 < qVar5) {
    QList<int>::size(&in_RDI->history);
    QList<int>::at((QList<int> *)in_stack_fffffffffffffed0,
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QWizard::page((QWizard *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                  in_stack_fffffffffffffeec);
    bVar2 = QWizardPage::isCommitPage((QWizardPage *)in_stack_fffffffffffffed0);
    if ((!bVar2) && ((in_RDI->canFinish & 1U) != 0)) {
      local_c.super_QFlagsStorage<QWizard::WizardOption>.i =
           (QFlagsStorage<QWizard::WizardOption>)
           QFlags<QWizard::WizardOption>::operator&
                     ((QFlags<QWizard::WizardOption> *)in_stack_fffffffffffffed0,
                      in_stack_fffffffffffffecc);
      QFlags<QWizard::WizardOption>::operator!((QFlags<QWizard::WizardOption> *)&local_c);
    }
  }
  QWidget::setEnabled((QWidget *)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
  QWidget::setEnabled((QWidget *)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
  QWidget::setEnabled((QWidget *)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
  QWidget::setEnabled((QWidget *)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
  bVar2 = buttonLayoutContains(in_stack_fffffffffffffee0,in_stack_fffffffffffffeec);
  local_c1 = false;
  uVar8 = extraout_RDX;
  if (bVar2) {
    qVar5 = QList<int>::size(&in_RDI->history);
    uVar8 = extraout_RDX_00;
    if (qVar5 < 2) {
      local_10.super_QFlagsStorage<QWizard::WizardOption>.i =
           (QFlagsStorage<QWizard::WizardOption>)
           QFlags<QWizard::WizardOption>::operator&
                     ((QFlags<QWizard::WizardOption> *)in_stack_fffffffffffffed0,
                      in_stack_fffffffffffffecc);
      bVar2 = QFlags<QWizard::WizardOption>::operator!((QFlags<QWizard::WizardOption> *)&local_10);
      local_c1 = false;
      uVar8 = extraout_RDX_01;
      if (!bVar2) goto LAB_007b5d32;
    }
    local_c2 = true;
    if ((in_RDI->canContinue & 1U) == 0) {
      local_14.super_QFlagsStorage<QWizard::WizardOption>.i =
           (QFlagsStorage<QWizard::WizardOption>)
           QFlags<QWizard::WizardOption>::operator&
                     ((QFlags<QWizard::WizardOption> *)in_stack_fffffffffffffed0,
                      in_stack_fffffffffffffecc);
      local_c2 = QFlags<QWizard::WizardOption>::operator!
                           ((QFlags<QWizard::WizardOption> *)&local_14);
      uVar8 = extraout_RDX_02;
    }
    local_c1 = local_c2;
  }
LAB_007b5d32:
  local_c3 = false;
  if (pQVar4 != (QWizardPage *)0x0) {
    local_c3 = QWizardPage::isCommitPage((QWizardPage *)in_stack_fffffffffffffed0);
    uVar8 = extraout_RDX_03;
  }
  pQVar1 = (in_RDI->field_20).btn.back;
  (**(code **)(*(long *)&pQVar1->super_QWidget + 0x68))(pQVar1,local_c1,uVar8,local_c1);
  pQVar1 = (in_RDI->field_20).btn.next;
  bVar2 = buttonLayoutContains(in_stack_fffffffffffffee0,in_stack_fffffffffffffeec);
  local_c4 = false;
  if ((bVar2) && (local_c4 = false, local_c3 == false)) {
    local_d1 = true;
    if ((in_RDI->canContinue & 1U) == 0) {
      local_18.super_QFlagsStorage<QWizard::WizardOption>.i =
           (QFlagsStorage<QWizard::WizardOption>)
           QFlags<QWizard::WizardOption>::operator&
                     ((QFlags<QWizard::WizardOption> *)in_stack_fffffffffffffed0,
                      in_stack_fffffffffffffecc);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
      local_d1 = IVar3 != 0;
    }
    local_c4 = local_d1;
  }
  (**(code **)(*(long *)&pQVar1->super_QWidget + 0x68))(pQVar1,local_c4);
  pQVar1 = (in_RDI->field_20).btn.commit;
  bVar2 = buttonLayoutContains(in_stack_fffffffffffffee0,in_stack_fffffffffffffeec);
  local_d2 = 0;
  if ((bVar2) && (local_d2 = 0, local_c3 != false)) {
    local_d2 = in_RDI->canContinue;
  }
  (**(code **)(*(long *)&pQVar1->super_QWidget + 0x68))(pQVar1,local_d2 & 1);
  pQVar1 = (in_RDI->field_20).btn.finish;
  bVar2 = buttonLayoutContains(in_stack_fffffffffffffee0,in_stack_fffffffffffffeec);
  local_e1 = false;
  if (bVar2) {
    local_f1 = true;
    if ((in_RDI->canFinish & 1U) == 0) {
      local_1c.super_QFlagsStorage<QWizard::WizardOption>.i =
           (QFlagsStorage<QWizard::WizardOption>)
           QFlags<QWizard::WizardOption>::operator&
                     ((QFlags<QWizard::WizardOption> *)in_stack_fffffffffffffed0,
                      in_stack_fffffffffffffecc);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
      local_f1 = IVar3 != 0;
    }
    local_e1 = local_f1;
  }
  (**(code **)(*(long *)&pQVar1->super_QWidget + 0x68))(pQVar1,local_e1);
  local_20.super_QFlagsStorage<QWizard::WizardOption>.i =
       (QFlagsStorage<QWizard::WizardOption>)
       QFlags<QWizard::WizardOption>::operator&
                 ((QFlags<QWizard::WizardOption> *)in_stack_fffffffffffffed0,
                  in_stack_fffffffffffffecc);
  bVar2 = QFlags<QWizard::WizardOption>::operator!((QFlags<QWizard::WizardOption> *)&local_20);
  if (bVar2) {
    pQVar1 = (in_RDI->field_20).btn.cancel;
    bVar2 = buttonLayoutContains(in_stack_fffffffffffffee0,in_stack_fffffffffffffeec);
    local_f2 = false;
    if (bVar2) {
      local_101 = true;
      if ((in_RDI->canContinue & 1U) == 0) {
        local_24.super_QFlagsStorage<QWizard::WizardOption>.i =
             (QFlagsStorage<QWizard::WizardOption>)
             QFlags<QWizard::WizardOption>::operator&
                       ((QFlags<QWizard::WizardOption> *)in_stack_fffffffffffffed0,
                        in_stack_fffffffffffffecc);
        local_101 = QFlags<QWizard::WizardOption>::operator!
                              ((QFlags<QWizard::WizardOption> *)&local_24);
      }
      local_f2 = local_101;
    }
    (**(code **)(*(long *)&pQVar1->super_QWidget + 0x68))(pQVar1,local_f2);
  }
  local_28.super_QFlagsStorage<QWizard::WizardOption>.i =
       (QFlagsStorage<QWizard::WizardOption>)
       QFlags<QWizard::WizardOption>::operator&
                 ((QFlags<QWizard::WizardOption> *)in_stack_fffffffffffffed0,
                  in_stack_fffffffffffffecc);
  bVar2 = QFlags<QWizard::WizardOption>::operator!((QFlags<QWizard::WizardOption> *)&local_28);
  pQVar6 = qobject_cast<QPushButton*>((QObject *)0x7b6056);
  if (pQVar6 != (QPushButton *)0x0) {
    QPushButton::setDefault
              ((QPushButton *)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
  }
  pQVar7 = (QWizardPrivate *)qobject_cast<QPushButton*>((QObject *)0x7b60d2);
  if (pQVar7 != (QWizardPrivate *)0x0) {
    QPushButton::setDefault((QPushButton *)pQVar7,(bool)in_stack_fffffffffffffedf);
    in_stack_fffffffffffffee0 = pQVar7;
  }
  pQVar7 = (QWizardPrivate *)qobject_cast<QPushButton*>((QObject *)0x7b614c);
  if (pQVar7 != (QWizardPrivate *)0x0) {
    enable = false;
    if ((in_RDI->canContinue & 1U) == 0) {
      enable = bVar2;
    }
    QPushButton::setDefault((QPushButton *)in_stack_fffffffffffffee0,enable);
    in_stack_fffffffffffffed0 = pQVar7;
  }
  enableUpdates(in_stack_fffffffffffffed0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::_q_updateButtonStates()
{
    Q_Q(QWizard);

    disableUpdates();

    const QWizardPage *page = q->currentPage();
    bool complete = page && page->isComplete();

    btn.back->setEnabled(history.size() > 1
                         && !q->page(history.at(history.size() - 2))->isCommitPage()
                         && (!canFinish || !(opts & QWizard::DisabledBackButtonOnLastPage)));
    btn.next->setEnabled(canContinue && complete);
    btn.commit->setEnabled(canContinue && complete);
    btn.finish->setEnabled(canFinish && complete);

    const bool backButtonVisible = buttonLayoutContains(QWizard::BackButton)
        && (history.size() > 1 || !(opts & QWizard::NoBackButtonOnStartPage))
        && (canContinue || !(opts & QWizard::NoBackButtonOnLastPage));
    bool commitPage = page && page->isCommitPage();
    btn.back->setVisible(backButtonVisible);
    btn.next->setVisible(buttonLayoutContains(QWizard::NextButton) && !commitPage
                         && (canContinue || (opts & QWizard::HaveNextButtonOnLastPage)));
    btn.commit->setVisible(buttonLayoutContains(QWizard::CommitButton) && commitPage
                           && canContinue);
    btn.finish->setVisible(buttonLayoutContains(QWizard::FinishButton)
                           && (canFinish || (opts & QWizard::HaveFinishButtonOnEarlyPages)));

    if (!(opts & QWizard::NoCancelButton))
        btn.cancel->setVisible(buttonLayoutContains(QWizard::CancelButton)
                               && (canContinue || !(opts & QWizard::NoCancelButtonOnLastPage)));

    bool useDefault = !(opts & QWizard::NoDefaultButton);
    if (QPushButton *nextPush = qobject_cast<QPushButton *>(btn.next))
        nextPush->setDefault(canContinue && useDefault && !commitPage);
    if (QPushButton *commitPush = qobject_cast<QPushButton *>(btn.commit))
        commitPush->setDefault(canContinue && useDefault && commitPage);
    if (QPushButton *finishPush = qobject_cast<QPushButton *>(btn.finish))
        finishPush->setDefault(!canContinue && useDefault);

#if QT_CONFIG(style_windowsvista)
    if (isVistaThemeEnabled()) {
        vistaHelper->backButton()->setEnabled(btn.back->isEnabled());
        vistaHelper->backButton()->setVisible(backButtonVisible);
        btn.back->setVisible(false);
    }
#endif

    enableUpdates();
}